

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingBase.cpp
# Opt level: O0

void __thiscall
Diligent::ResourceMappingImpl::RemoveResourceByName
          (ResourceMappingImpl *this,Char *Name,Uint32 ArrayIndex)

{
  ResMappingHashKey local_40;
  lock_guard<Threading::SpinLock> local_28;
  SpinLockGuard Guard;
  Uint32 ArrayIndex_local;
  Char *Name_local;
  ResourceMappingImpl *this_local;
  
  if (*Name != '\0') {
    Guard._M_device._4_4_ = ArrayIndex;
    std::lock_guard<Threading::SpinLock>::lock_guard(&local_28,&this->m_Lock);
    ResMappingHashKey::ResMappingHashKey(&local_40,Name,false,Guard._M_device._4_4_);
    std::
    unordered_map<Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_Diligent::HashMapStringKey::Hasher,_std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,_Diligent::STDAllocator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::IMemoryAllocator>_>
    ::erase(&this->m_HashTable,&local_40);
    ResMappingHashKey::~ResMappingHashKey(&local_40);
    std::lock_guard<Threading::SpinLock>::~lock_guard(&local_28);
  }
  return;
}

Assistant:

void ResourceMappingImpl::RemoveResourceByName(const Char* Name, Uint32 ArrayIndex)
{
    if (*Name == 0)
        return;

    Threading::SpinLockGuard Guard{m_Lock};
    // Remove object with the given name
    // Name will be implicitly converted to HashMapStringKey without making a copy
    m_HashTable.erase(ResMappingHashKey{Name, false, ArrayIndex});
}